

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_hdr_total_length(lws *wsi,lws_token_indexes h)

{
  allocated_headers *paVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  
  paVar1 = (wsi->http).ah;
  iVar2 = 0;
  if ((paVar1 != (allocated_headers *)0x0) && (bVar3 = paVar1->frag_index[h], iVar2 = 0, bVar3 != 0)
     ) {
    iVar4 = 0;
    do {
      iVar2 = (uint)paVar1->frags[bVar3].len + iVar4;
      bVar3 = paVar1->frags[bVar3].nfrag;
      iVar4 = (uint)(bVar3 != 0 && h != WSI_TOKEN_HTTP_COOKIE) + iVar2;
    } while (bVar3 != 0);
  }
  return iVar2;
}

Assistant:

int lws_hdr_total_length(struct lws *wsi, enum lws_token_indexes h)
{
	int n;
	int len = 0;

	if (!wsi->http.ah)
		return 0;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return 0;
	do {
		len += wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (n && h != WSI_TOKEN_HTTP_COOKIE)
			++len;

	} while (n);

	return len;
}